

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 roundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,uint64_t zSig2,
                   float_status *status)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  float128 fVar6;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t zSig2_local;
  
  bVar1 = status->float_rounding_mode;
  uVar3 = (ulong)bVar1;
  local_40 = zSig1;
  local_38 = zSig0;
  zSig2_local = zSig2;
  if (5 < uVar3) {
    abort();
  }
  uVar4 = (ulong)(uint)zExp;
  switch(uVar3) {
  default:
    bVar2 = (byte)(zSig2 >> 0x3f);
    goto LAB_00b1e63e;
  case 1:
    bVar5 = zSign != '\0';
    break;
  case 2:
    bVar5 = zSign == '\0';
    break;
  case 3:
    bVar2 = 0;
    goto LAB_00b1e63e;
  case 5:
    bVar5 = (zSig1 & 1) == 0;
  }
  bVar2 = zSig2 != 0 & bVar5;
LAB_00b1e63e:
  if (0x7ffc < (uint)zExp) {
    if (0x7ffd < zExp) {
LAB_00b1e649:
      status->float_exception_flags = status->float_exception_flags | 0x28;
      if (((bVar1 == 3) || (zSign != '\0' && bVar1 == 2)) ||
         ((bVar1 == 5 || (bVar1 == 1 && zSign == '\0')))) {
        uVar3 = (ulong)zSign << 0x3f | 0x7ffeffffffffffff;
        zSig1 = 0xffffffffffffffff;
      }
      else {
        uVar3 = (ulong)zSign << 0x3f | 0x7fff000000000000;
        zSig1 = 0;
      }
      goto LAB_00b1e70f;
    }
    if (zExp == 0x7ffd) {
      uVar4 = 0x7ffd;
      if (((zSig0 == 0x1ffffffffffff) && (zSig1 == 0xffffffffffffffff)) && (bVar2 != 0))
      goto LAB_00b1e649;
    }
    else if (zExp < 0) {
      if (status->flush_to_zero == '\0') {
        bVar5 = true;
        if (((zExp == -1) && (status->float_detect_tininess != '\x01')) && (bVar2 != 0)) {
          bVar5 = zSig1 != 0xffffffffffffffff && zSig0 == 0x1ffffffffffff || zSig0 < 0x1ffffffffffff
          ;
        }
        shift128ExtraRightJamming(zSig0,zSig1,zSig2,-zExp,&local_38,&local_40,&zSig2_local);
        if ((bool)(zSig2_local != 0 & bVar5)) {
          status->float_exception_flags = status->float_exception_flags | 0x10;
        }
        fVar6 = (float128)(*(code *)(&DAT_00bd2938 + *(int *)(&DAT_00bd2938 + uVar3 * 4)))();
        return fVar6;
      }
      status->float_exception_flags = status->float_exception_flags | 0x80;
      uVar3 = (ulong)zSign << 0x3f;
      zSig1 = 0;
      goto LAB_00b1e70f;
    }
  }
  if (zSig2 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  if (bVar2 == 0) {
    if (zSig1 == 0 && zSig0 == 0) {
      uVar4 = 0;
    }
  }
  else {
    zSig0 = zSig0 + (0xfffffffffffffffe < zSig1);
    zSig1 = zSig1 + 1 & ~(ulong)((zSig2 & 0x7fffffffffffffff) == 0 && bVar1 == 0);
  }
  uVar3 = (uVar4 << 0x30) + ((ulong)zSign << 0x3f) + zSig0;
LAB_00b1e70f:
  fVar6.high = uVar3;
  fVar6.low = zSig1;
  return fVar6;
}

Assistant:

static float128 roundAndPackFloat128(flag zSign, int32_t zExp,
                                     uint64_t zSig0, uint64_t zSig1,
                                     uint64_t zSig2, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig2 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig2;
        break;
    case float_round_down:
        increment = zSign && zSig2;
        break;
    case float_round_to_odd:
        increment = !(zSig1 & 0x1) && zSig2;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) zExp ) {
        if (    ( 0x7FFD < zExp )
             || (    ( zExp == 0x7FFD )
                  && eq128(
                         UINT64_C(0x0001FFFFFFFFFFFF),
                         UINT64_C(0xFFFFFFFFFFFFFFFF),
                         zSig0,
                         zSig1
                     )
                  && increment
                )
           ) {
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
                 || (roundingMode == float_round_to_odd)
               ) {
                return
                    packFloat128(
                        zSign,
                        0x7FFE,
                        UINT64_C(0x0000FFFFFFFFFFFF),
                        UINT64_C(0xFFFFFFFFFFFFFFFF)
                    );
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat128(zSign, 0, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ! increment
                || lt128(
                       zSig0,
                       zSig1,
                       UINT64_C(0x0001FFFFFFFFFFFF),
                       UINT64_C(0xFFFFFFFFFFFFFFFF)
                   );
            shift128ExtraRightJamming(
                zSig0, zSig1, zSig2, - zExp, &zSig0, &zSig1, &zSig2 );
            zExp = 0;
            if (isTiny && zSig2) {
                float_raise(float_flag_underflow, status);
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig2 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig2;
                break;
            case float_round_down:
                increment = zSign && zSig2;
                break;
            case float_round_to_odd:
                increment = !(zSig1 & 0x1) && zSig2;
                break;
            default:
                abort();
            }
        }
    }
    if (zSig2) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        add128( zSig0, zSig1, 0, 1, &zSig0, &zSig1 );
        zSig1 &= ~ ( ( zSig2 + zSig2 == 0 ) & roundNearestEven );
    }
    else {
        if ( ( zSig0 | zSig1 ) == 0 ) zExp = 0;
    }
    return packFloat128( zSign, zExp, zSig0, zSig1 );

}